

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O3

QString * anon_unknown.dwarf_a83dc::expandEnum
                    (QString *__return_storage_ptr__,QString *value,QString *prefix)

{
  qsizetype qVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  char cVar6;
  QString *pQVar7;
  long in_FS_OFFSET;
  QLatin1String QVar8;
  QStringBuilder<QStringBuilder<const_QString_&,_QLatin1String>,_QString_&> local_48;
  QString *local_28;
  
  local_28 = *(QString **)(in_FS_OFFSET + 0x28);
  cVar6 = QString::startsWith(value,(CaseSensitivity)prefix);
  if (cVar6 == '\0') {
    QVar8.m_data = (char *)0x2;
    QVar8.m_size = (qsizetype)value;
    pQVar7 = (QString *)QString::lastIndexOf(QVar8,0x177daf,(CaseSensitivity)(value->d).size);
    if (pQVar7 == (QString *)0xffffffffffffffff) {
      local_48.a.b.m_size = 2;
      local_48.a.b.m_data = "::";
      local_48.a.a = prefix;
      local_48.b = value;
      QStringBuilder<QStringBuilder<const_QString_&,_QLatin1String>,_QString_&>::convertTo<QString>
                (__return_storage_ptr__,&local_48);
      goto LAB_00133b5b;
    }
    QString::replace((longlong)value,0,pQVar7);
  }
  uVar2 = *(undefined4 *)&(value->d).d;
  uVar3 = *(undefined4 *)((long)&(value->d).d + 4);
  uVar4 = *(undefined4 *)&(value->d).ptr;
  uVar5 = *(undefined4 *)((long)&(value->d).ptr + 4);
  (value->d).d = (Data *)0x0;
  (value->d).ptr = (char16_t *)0x0;
  *(undefined4 *)&(__return_storage_ptr__->d).d = uVar2;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = uVar3;
  *(undefined4 *)&(__return_storage_ptr__->d).ptr = uVar4;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = uVar5;
  qVar1 = (value->d).size;
  (value->d).size = 0;
  (__return_storage_ptr__->d).size = qVar1;
LAB_00133b5b:
  if (*(QString **)(in_FS_OFFSET + 0x28) == local_28) {
    return *(QString **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

QString expandEnum(QString value, const QString &prefix)
    {
        if (value.startsWith(prefix))
            return value;
        const auto pos = value.lastIndexOf("::"_L1);
        if (pos == -1)
            return prefix + "::"_L1 + value;
        value.replace(0, pos, prefix);
        return value;
    }